

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O3

BlockCode __thiscall
s2coding::GetBlockCode
          (s2coding *this,Span<const_unsigned_long_long> values,uint64 base,bool have_exceptions)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  pointer puVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  BlockCode BVar15;
  S2LogMessage SStack_28;
  
  puVar11 = values.ptr_;
  uVar2 = 4;
  if (puVar11 != (pointer)0x0) {
    bVar1 = (byte)base;
    lVar14 = 0;
    uVar9 = 0;
    uVar3 = 0xffffffffffffffff;
    do {
      uVar13 = *(ulong *)(this + lVar14);
      uVar12 = uVar3;
      if (uVar13 < uVar3) {
        uVar12 = uVar13;
      }
      uVar8 = uVar13;
      if (uVar13 < uVar9) {
        uVar8 = uVar9;
      }
      if (uVar13 == 0xffffffffffffffff) {
        uVar12 = uVar3;
        uVar8 = uVar9;
      }
      uVar9 = uVar8;
      lVar14 = lVar14 + 8;
      uVar3 = uVar12;
    } while ((long)puVar11 * 8 - lVar14 != 0);
    if (uVar12 != 0xffffffffffffffff) {
      uVar13 = uVar12 - values.len_;
      uVar3 = uVar9 - values.len_;
      lVar14 = 0x3f;
      if (uVar3 - uVar13 != 0) {
        for (; uVar3 - uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      uVar6 = 4;
      if (uVar9 != uVar12) {
        uVar6 = (int)lVar14 + 3 + (uint)((int)lVar14 == 0) & 0x7c;
      }
      cVar4 = (char)uVar6;
      uVar2 = 0xffffffffffffffff >> (-cVar4 & 0x3fU);
      uVar9 = 0;
      uVar12 = (-(ulong)(uVar6 == 0) | ~uVar2) & uVar13;
      if (uVar6 == 0) {
        uVar2 = uVar9;
      }
      uVar8 = uVar2;
      if (bVar1 != 0) {
        if (0xf < uVar2) {
          uVar8 = uVar2 - 0x10;
          goto LAB_0018c4d8;
        }
LAB_0018c52e:
        if (0x3c < uVar6) {
          S2LogMessage::S2LogMessage
                    (&SStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x2da,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_28.stream_,"Check failed: (delta_bits) <= (60) ",0x23);
          goto LAB_0018c754;
        }
        uVar2 = (ulong)(uVar6 + 4);
        uVar9 = 0xffffffffffffffff >> (0x3cU - cVar4 & 0x3f);
        uVar8 = ~uVar9;
        uVar13 = uVar13 & uVar8;
        if (bVar1 == 0) {
          if (uVar3 <= uVar13 + uVar9) {
LAB_0018c5fb:
            bVar5 = 0;
            iVar7 = 0;
            goto LAB_0018c5fd;
          }
LAB_0018c5aa:
          iVar7 = 4;
          bVar5 = 1;
          if ((uVar8 < uVar12) || (uVar3 <= uVar9 + uVar12)) goto LAB_0018c5fd;
        }
        else if (uVar6 != 0) {
          if ((0xf - uVar9 < uVar13) || (uVar3 <= (uVar9 + uVar13) - 0x10)) goto LAB_0018c5fb;
          if (bVar1 != 0) {
            uVar8 = 0xf - uVar9;
            uVar9 = uVar9 - 0x10;
          }
          goto LAB_0018c5aa;
        }
        S2LogMessage::S2LogMessage
                  (&SStack_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x2dd,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_28.stream_,
                   "Check failed: CanEncode(b_min, b_max, delta_bits, 4, have_exceptions) ",0x46);
LAB_0018c754:
        abort();
      }
LAB_0018c4d8:
      if ((CARRY8(uVar8,uVar12)) || (uVar3 <= uVar8 + uVar12)) {
        iVar7 = 0;
      }
      else {
        uVar8 = ~(0xffffffffffffffffU >> (0x44U - cVar4 & 0x3f));
        if (uVar6 == 4) {
          uVar8 = 0xffffffffffffffff;
        }
        if (bVar1 != 0) {
          if (uVar2 < 0x10) goto LAB_0018c52e;
          uVar2 = uVar2 - 0x10;
        }
        iVar7 = 4;
        uVar9 = 1;
        if ((!CARRY8(uVar8 & uVar13,uVar2)) && ((uVar8 & uVar13) + uVar2 < uVar3))
        goto LAB_0018c52e;
      }
      bVar5 = (byte)uVar9;
      uVar2 = (ulong)uVar6;
LAB_0018c5fd:
      if (puVar11 == (pointer)0x1) {
        if ((~bVar5 & (int)uVar2 == 4) == 0) {
          S2LogMessage::S2LogMessage
                    (&SStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x2e6,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_28.stream_,"Check failed: delta_bits == 4 && overlap_bits == 0 ",0x33);
          goto LAB_0018c754;
        }
        uVar2 = 8;
        uVar9 = 0xff;
      }
      else {
        uVar9 = 0;
        if ((int)uVar2 != 0) {
          uVar9 = 0xffffffffffffffff >> (-(char)uVar2 & 0x3fU);
        }
      }
      uVar9 = (uVar9 + (ulong)(bVar1 ^ 1) * 0x10) - 0x10;
      lVar14 = uVar3 - uVar9;
      if (uVar3 < uVar9 || lVar14 == 0) {
        uVar9 = 0;
      }
      else {
        iVar10 = (int)uVar2 - iVar7;
        uVar9 = 0;
        if (iVar10 != 0) {
          uVar9 = 0xffffffffffffffff >> (-((char)uVar2 - (char)iVar7) & 0x3fU);
        }
        uVar9 = ~uVar9 & lVar14 + uVar9;
        if (uVar9 == 0) {
          S2LogMessage::S2LogMessage
                    (&SStack_28,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x2f4,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_28.stream_,"Check failed: (min_offset) > (0) ",0x21);
          goto LAB_0018c754;
        }
        lVar14 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        uVar6 = 0x47 - (iVar10 + ((uint)lVar14 ^ 0x3f)) & 0xfffffff8;
        if (uVar6 == 0x40) {
          iVar7 = 4;
        }
        uVar9 = (ulong)uVar6 << 0x20;
      }
      uVar2 = uVar2 | uVar9;
      goto LAB_0018c69e;
    }
  }
  iVar7 = 0;
LAB_0018c69e:
  BVar15.overlap_bits = iVar7;
  BVar15.delta_bits = (int)uVar2;
  BVar15.offset_bits = (int)(uVar2 >> 0x20);
  return BVar15;
}

Assistant:

BlockCode GetBlockCode(Span<const uint64> values, uint64 base,
                       bool have_exceptions) {
  // "b_min" and "b_max"n are the minimum and maximum values within this block.
  uint64 b_min = kException, b_max = 0;
  for (uint64 v : values) {
    if (v != kException) {
      b_min = min(b_min, v);
      b_max = max(b_max, v);
    }
  }
  if (b_min == kException) {
    // All values in this block are exceptions.
    return BlockCode{4, 0, 0};
  }

  // Adjust the min/max values so that they are relative to "base".
  b_min -= base;
  b_max -= base;

  // Determine the minimum possible delta length and overlap that can be used
  // to encode this block.  The block will usually be encodable using the
  // number of bits in (b_max - b_min) rounded up to a multiple of 4.  If this
  // is not possible, the preferred solution is to shift "offset" so that the
  // delta and offset values overlap by 4 bits (since this only costs an
  // average of 4 extra bits per block).  Otherwise we increase the delta size
  // by 4 bits.  Certain cases require that both of these techniques are used.
  //
  // Example 1: b_min = 0x72, b_max = 0x7e.  The range is 0x0c.  This can be
  // encoded using delta_bits = 4 and overlap_bits = 0, which allows us to
  // represent an offset of 0x70 and a maximum delta of 0x0f, so that we can
  // encode values up to 0x7f.
  //
  // Example 2: b_min = 0x78, b_max = 0x84.  The range is 0x0c, but in this
  // case it is not sufficient to use delta_bits = 4 and overlap_bits = 0
  // because we can again only represent an offset of 0x70, so the maximum
  // delta of 0x0f only lets us encode values up to 0x7f.  However if we
  // increase the overlap to 4 bits then we can represent an offset of 0x78,
  // which lets us encode values up to 0x78 + 0x0f = 0x87.
  //
  // Example 3: b_min = 0x08, b_max = 0x104.  The range is 0xfc, so we should
  // be able to use 8-bit deltas.  But even with a 4-bit overlap, we can still
  // only encode offset = 0 and a maximum value of 0xff.  (We don't allow
  // bigger overlaps because statistically they are not worthwhile.)  Instead
  // we increase the delta size to 12 bits, which handles this case easily.
  //
  // Example 4: b_min = 0xf08, b_max = 0x1004.  The range is 0xfc, so we
  // should be able to use 8-bit deltas.  With 8-bit deltas and no overlap, we
  // have offset = 0xf00 and a maximum encodable value of 0xfff.  With 8-bit
  // deltas and a 4-bit overlap, we still have offset = 0xf00 and a maximum
  // encodable value of 0xfff.  Even with 12-bit deltas, we have offset = 0
  // and we can still only represent 0xfff.  However with delta_bits = 12 and
  // overlap_bits = 4, we can represent offset = 0xf00 and a maximum encodable
  // value of 0xf00 + 0xfff = 0x1eff.
  //
  // It is possible to show that this last example is the worst case, i.e.  we
  // do not need to consider increasing delta_bits or overlap_bits further.
  int delta_bits = (max(1, Bits::Log2Floor64(b_max - b_min)) + 3) & ~3;
  int overlap_bits = 0;
  if (!CanEncode(b_min, b_max, delta_bits, 0, have_exceptions)) {
    if (CanEncode(b_min, b_max, delta_bits, 4, have_exceptions)) {
      overlap_bits = 4;
    } else {
      S2_DCHECK_LE(delta_bits, 60);
      delta_bits += 4;
      if (!CanEncode(b_min, b_max, delta_bits, 0, have_exceptions)) {
        S2_DCHECK(CanEncode(b_min, b_max, delta_bits, 4, have_exceptions));
        overlap_bits = 4;
      }
    }
  }

  // Avoid wasting 4 bits of delta when the block size is 1.  This reduces the
  // encoding size for single leaf cells by one byte.
  if (values.size() == 1) {
    S2_DCHECK(delta_bits == 4 && overlap_bits == 0);
    delta_bits = 8;
  }

  // Now determine the number of bytes needed to encode "offset", given the
  // chosen delta length.
  uint64 max_delta = BitMask(delta_bits) - (have_exceptions ? kBlockSize : 0);
  int offset_bits = 0;
  if (b_max > max_delta) {
    // At least one byte of offset is required.  Round up the minimum offset
    // to the next encodable value, and determine how many bits it has.
    int offset_shift = delta_bits - overlap_bits;
    uint64 mask = BitMask(offset_shift);
    uint64 min_offset = (b_max - max_delta + mask) & ~mask;
    S2_DCHECK_GT(min_offset, 0);
    offset_bits =
        (Bits::FindMSBSetNonZero64(min_offset) + 1 - offset_shift + 7) & ~7;
    // A 64-bit offset can only be encoded with an overlap of 4 bits.
    if (offset_bits == 64) overlap_bits = 4;
  }
  return BlockCode{delta_bits, offset_bits, overlap_bits};
}